

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

void add_param(cod_parse_context parse_context,char *name,int param_num,FMFormat format)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  long *plVar4;
  
  puVar1 = (undefined8 *)format_list_of_FMFormat(format);
  lVar3 = puVar1[4];
  if (lVar3 != 0) {
    plVar4 = puVar1 + 8;
    do {
      cod_add_simple_struct_type(lVar3,plVar4[-3],parse_context);
      lVar3 = *plVar4;
      plVar4 = plVar4 + 4;
    } while (lVar3 != 0);
  }
  uVar2 = cod_build_type_node(*puVar1,puVar1[1]);
  cod_add_decl_to_parse_context(*puVar1,uVar2,parse_context);
  uVar2 = cod_build_param_node(name,uVar2,param_num);
  cod_add_decl_to_parse_context(name,uVar2,parse_context);
  return;
}

Assistant:

static void
add_param(cod_parse_context parse_context, char *name, int param_num,
	  FMFormat format)
{
    FMStructDescList list = format_list_of_FMFormat(format);
    int i = 1;
    sm_ref type, param;
    while (list[i].format_name != NULL) {
	FMFieldList fl = list[i].field_list;
	/* step through input formats */
	cod_add_simple_struct_type(list[i].format_name, fl, parse_context);
	i++;
    }
    type = cod_build_type_node(list[0].format_name, list[0].field_list);
    cod_add_decl_to_parse_context(list[0].format_name, type, parse_context);

    param = cod_build_param_node(name, type, param_num);

    cod_add_decl_to_parse_context(name, param, parse_context);
}